

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op-gvec.c
# Opt level: O0

void gen_dup_i64(TCGContext_conflict9 *tcg_ctx,uint vece,TCGv_i64 out,TCGv_i64 in)

{
  TCGv_i64 in_local;
  TCGv_i64 out_local;
  uint vece_local;
  TCGContext_conflict9 *tcg_ctx_local;
  
  switch(vece) {
  case 0:
    tcg_gen_ext8u_i64_tricore(tcg_ctx,out,in);
    tcg_gen_muli_i64_tricore(tcg_ctx,out,out,0x101010101010101);
    break;
  case 1:
    tcg_gen_ext16u_i64_tricore(tcg_ctx,out,in);
    tcg_gen_muli_i64_tricore(tcg_ctx,out,out,0x1000100010001);
    break;
  case 2:
    tcg_gen_deposit_i64_tricore(tcg_ctx,out,in,in,0x20,0x20);
    break;
  case 3:
    tcg_gen_mov_i64_tricore(tcg_ctx,out,in);
  }
  return;
}

Assistant:

static void gen_dup_i64(TCGContext *tcg_ctx, unsigned vece, TCGv_i64 out, TCGv_i64 in)
{
    switch (vece) {
    case MO_8:
        tcg_gen_ext8u_i64(tcg_ctx, out, in);
        tcg_gen_muli_i64(tcg_ctx, out, out, 0x0101010101010101ull);
        break;
    case MO_16:
        tcg_gen_ext16u_i64(tcg_ctx, out, in);
        tcg_gen_muli_i64(tcg_ctx, out, out, 0x0001000100010001ull);
        break;
    case MO_32:
        tcg_gen_deposit_i64(tcg_ctx, out, in, in, 32, 32);
        break;
    case MO_64:
        tcg_gen_mov_i64(tcg_ctx, out, in);
        break;
    default:
        // g_assert_not_reached();
        break;
    }
}